

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

void examine_app0(j_decompress_ptr cinfo,JOCTET *data,uint datalen,JLONG remaining)

{
  ulong uVar1;
  byte bVar2;
  JOCTET JVar3;
  undefined4 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  uint6 uVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  jpeg_error_mgr *pjVar22;
  long lVar23;
  
  lVar23 = (ulong)datalen + remaining;
  if ((((datalen < 0xe) || (*data != 'J')) || (data[1] != 'F')) ||
     (((data[2] != 'I' || (data[3] != 'F')) || (data[4] != '\0')))) {
    if (((datalen < 6) || (*data != 'J')) ||
       ((data[1] != 'F' || (((data[2] != 'X' || (data[3] != 'X')) || (data[4] != '\0')))))) {
      pjVar22 = cinfo->err;
      pjVar22->msg_code = 0x4d;
    }
    else {
      JVar3 = data[5];
      pjVar22 = cinfo->err;
      if (JVar3 == '\x13') {
        pjVar22->msg_code = 0x6e;
      }
      else if (JVar3 == '\x11') {
        pjVar22->msg_code = 0x6d;
      }
      else {
        if (JVar3 != '\x10') {
          pjVar22->msg_code = 0x59;
          *(uint *)&pjVar22->msg_parm = (uint)data[5];
          (cinfo->err->msg_parm).i[1] = (int)lVar23;
          goto LAB_00126688;
        }
        pjVar22->msg_code = 0x6c;
      }
    }
  }
  else {
    cinfo->saw_JFIF_marker = 1;
    bVar2 = data[5];
    cinfo->JFIF_major_version = bVar2;
    cinfo->JFIF_minor_version = data[6];
    cinfo->density_unit = data[7];
    cinfo->X_density = *(ushort *)(data + 8) << 8 | *(ushort *)(data + 8) >> 8;
    cinfo->Y_density = *(ushort *)(data + 10) << 8 | *(ushort *)(data + 10) >> 8;
    if (bVar2 != 1) {
      pjVar22 = cinfo->err;
      pjVar22->msg_code = 0x77;
      (pjVar22->msg_parm).i[0] = (uint)bVar2;
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    pjVar22 = cinfo->err;
    uVar1._0_1_ = cinfo->JFIF_major_version;
    uVar1._1_1_ = cinfo->JFIF_minor_version;
    uVar1._2_1_ = cinfo->density_unit;
    uVar1._3_1_ = cinfo->field_0x17b;
    uVar1._4_2_ = cinfo->X_density;
    uVar1._6_2_ = cinfo->Y_density;
    auVar5._8_6_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[0xe] = (char)((ushort)uVar1._6_2_ >> 8);
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7[0xc] = (char)uVar1._6_2_;
    auVar7._13_2_ = auVar5._13_2_;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar1;
    auVar8._12_3_ = auVar7._12_3_;
    auVar9._8_2_ = 0;
    auVar9._0_8_ = uVar1;
    auVar9[10] = (char)((ushort)uVar1._4_2_ >> 8);
    auVar9._11_4_ = auVar8._11_4_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11._10_5_ = auVar9._10_5_;
    auVar13[8] = (char)uVar1._4_2_;
    auVar13._0_8_ = uVar1;
    auVar13._9_6_ = auVar11._9_6_;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = auVar13._8_7_;
    Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),uVar1._3_1_);
    auVar20._9_6_ = 0;
    auVar20._0_9_ = Var16;
    auVar17._1_10_ = SUB1510(auVar20 << 0x30,5);
    auVar17[0] = uVar1._2_1_;
    auVar21._11_4_ = 0;
    auVar21._0_11_ = auVar17;
    auVar18._1_12_ = SUB1512(auVar21 << 0x20,3);
    auVar18[0] = uVar1._1_1_;
    auVar14._2_13_ = auVar18;
    auVar14._0_2_ = CONCAT11(0,(undefined1)uVar1);
    auVar6._10_2_ = 0;
    auVar6._0_10_ = auVar14._0_10_;
    auVar6._12_2_ = (short)Var16;
    auVar19._2_4_ = auVar6._10_4_;
    auVar19._0_2_ = auVar17._0_2_;
    auVar19._6_8_ = 0;
    auVar12._6_8_ = SUB148(auVar19 << 0x40,6);
    auVar12._4_2_ = auVar18._0_2_;
    auVar12._2_2_ = 0;
    auVar12._0_2_ = CONCAT11(0,(undefined1)uVar1);
    *(long *)&pjVar22->msg_parm = auVar12._0_8_;
    uVar4._0_2_ = cinfo->X_density;
    uVar4._2_2_ = cinfo->Y_density;
    uVar10 = CONCAT24(uVar4._2_2_,uVar4);
    *(ulong *)((long)&pjVar22->msg_parm + 8) = (ulong)uVar10 & 0xffffffff0000ffff;
    *(uint *)((long)&pjVar22->msg_parm + 0x10) = (uint)cinfo->density_unit;
    pjVar22->msg_code = 0x57;
    (*pjVar22->emit_message)((j_common_ptr)cinfo,1);
    if (data[0xd] != '\0' || data[0xc] != '\0') {
      pjVar22 = cinfo->err;
      pjVar22->msg_code = 0x5a;
      *(uint *)&pjVar22->msg_parm = (uint)data[0xc];
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)data[0xd];
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    lVar23 = lVar23 + -0xe;
    if (lVar23 == (ulong)data[0xd] * (ulong)data[0xc] * 3) {
      return;
    }
    pjVar22 = cinfo->err;
    pjVar22->msg_code = 0x58;
  }
  (pjVar22->msg_parm).i[0] = (int)lVar23;
LAB_00126688:
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

LOCAL(void)
examine_app0(j_decompress_ptr cinfo, JOCTET *data, unsigned int datalen,
             JLONG remaining)
/* Examine first few bytes from an APP0.
 * Take appropriate action if it is a JFIF marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  JLONG totallen = (JLONG)datalen + remaining;

  if (datalen >= APP0_DATA_LEN &&
      data[0] == 0x4A &&
      data[1] == 0x46 &&
      data[2] == 0x49 &&
      data[3] == 0x46 &&
      data[4] == 0) {
    /* Found JFIF APP0 marker: save info */
    cinfo->saw_JFIF_marker = TRUE;
    cinfo->JFIF_major_version = data[5];
    cinfo->JFIF_minor_version = data[6];
    cinfo->density_unit = data[7];
    cinfo->X_density = (data[8] << 8) + data[9];
    cinfo->Y_density = (data[10] << 8) + data[11];
    /* Check version.
     * Major version must be 1, anything else signals an incompatible change.
     * (We used to treat this as an error, but now it's a nonfatal warning,
     * because some bozo at Hijaak couldn't read the spec.)
     * Minor version should be 0..2, but process anyway if newer.
     */
    if (cinfo->JFIF_major_version != 1)
      WARNMS2(cinfo, JWRN_JFIF_MAJOR,
              cinfo->JFIF_major_version, cinfo->JFIF_minor_version);
    /* Generate trace messages */
    TRACEMS5(cinfo, 1, JTRC_JFIF,
             cinfo->JFIF_major_version, cinfo->JFIF_minor_version,
             cinfo->X_density, cinfo->Y_density, cinfo->density_unit);
    /* Validate thumbnail dimensions and issue appropriate messages */
    if (data[12] | data[13])
      TRACEMS2(cinfo, 1, JTRC_JFIF_THUMBNAIL, data[12], data[13]);
    totallen -= APP0_DATA_LEN;
    if (totallen != ((JLONG)data[12] * (JLONG)data[13] * (JLONG)3))
      TRACEMS1(cinfo, 1, JTRC_JFIF_BADTHUMBNAILSIZE, (int)totallen);
  } else if (datalen >= 6 &&
             data[0] == 0x4A &&
             data[1] == 0x46 &&
             data[2] == 0x58 &&
             data[3] == 0x58 &&
             data[4] == 0) {
    /* Found JFIF "JFXX" extension APP0 marker */
    /* The library doesn't actually do anything with these,
     * but we try to produce a helpful trace message.
     */
    switch (data[5]) {
    case 0x10:
      TRACEMS1(cinfo, 1, JTRC_THUMB_JPEG, (int)totallen);
      break;
    case 0x11:
      TRACEMS1(cinfo, 1, JTRC_THUMB_PALETTE, (int)totallen);
      break;
    case 0x13:
      TRACEMS1(cinfo, 1, JTRC_THUMB_RGB, (int)totallen);
      break;
    default:
      TRACEMS2(cinfo, 1, JTRC_JFIF_EXTENSION, data[5], (int)totallen);
      break;
    }
  } else {
    /* Start of APP0 does not match "JFIF" or "JFXX", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP0, (int)totallen);
  }
}